

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StringItoAMethod::StringItoAMethod
          (StringItoAMethod *this,Builtins *builtins,KnownSystemName knownNameId,LiteralBase base)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_51;
  Type *local_50;
  _Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_48;
  
  local_50 = (Type *)&builtins->integerType;
  __l._M_len = 1;
  __l._M_array = &local_50;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_48,__l,&local_51);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,knownNameId,Function,1,
             (vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
             &local_48,&(builtins->voidType).super_Type,true,true);
  std::_Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::
  ~_Vector_base(&local_48);
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_005a4aa0;
  (this->super_SimpleSystemSubroutine).field_0x62 = base;
  return;
}

Assistant:

StringItoAMethod(const Builtins& builtins, KnownSystemName knownNameId, LiteralBase base) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 1, {&builtins.integerType},
                               builtins.voidType, true, /* isFirstArgLValue */ true),
        base(base) {}